

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O1

int __thiscall SPSUnit::mvc_vui_parameters_extension(SPSUnit *this)

{
  BitStreamReader *this_00;
  vector<HRDParams,_std::allocator<HRDParams>_> *this_01;
  vector<HRDParams,_std::allocator<HRDParams>_> *this_02;
  int iVar1;
  int iVar2;
  pointer pHVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vui_mvc_temporal_id;
  bool local_69;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_38;
  
  this_00 = &(this->super_NALUnit).bitReader;
  uVar9 = 0xffffffff;
  do {
    bVar4 = BitStreamReader::getBit(this_00);
    uVar9 = uVar9 + 1;
  } while (!bVar4);
  if (0x20 < uVar9) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = &PTR__exception_0023f8a8;
    __cxa_throw(puVar8,&BitStreamException::typeinfo,std::exception::~exception);
  }
  uVar6 = 1;
  uVar5 = BitStreamReader::getBits(this_00,uVar9);
  uVar5 = uVar5 + (1 << ((byte)uVar9 & 0x1f));
  if (uVar5 < 0x401) {
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar10 = (ulong)uVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_58,uVar10);
    std::vector<int,_std::allocator<int>_>::resize(&this->mvcHrdParamsBitPos,uVar10);
    this_01 = &this->mvcNalHrdParams;
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize(this_01,uVar10);
    this_02 = &this->mvcVclHrdParams;
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize(this_02,uVar10);
    local_69 = uVar5 != 0;
    if (local_69) {
      uVar11 = 0;
      local_38 = uVar10;
      do {
        uVar9 = BitStreamReader::getBits(this_00,3);
        local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = (uchar)uVar9;
        uVar9 = 0xffffffff;
        do {
          bVar4 = BitStreamReader::getBit(this_00);
          uVar9 = uVar9 + 1;
        } while (!bVar4);
        if (0x20 < uVar9) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = &PTR__exception_0023f8a8;
          __cxa_throw(puVar8,&BitStreamException::typeinfo,std::exception::~exception);
        }
        uVar5 = BitStreamReader::getBits(this_00,uVar9);
        uVar5 = uVar5 + (1 << ((byte)uVar9 & 0x1f));
        if (0x400 < uVar5) break;
        if (uVar5 != 0) {
          uVar10 = 0;
          do {
            uVar9 = 0xffffffff;
            do {
              bVar4 = BitStreamReader::getBit(this_00);
              uVar9 = uVar9 + 1;
            } while (!bVar4);
            if (0x20 < uVar9) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar8 = &PTR__exception_0023f8a8;
              __cxa_throw(puVar8,&BitStreamException::typeinfo,std::exception::~exception);
            }
            uVar6 = BitStreamReader::getBits(this_00,uVar9);
            if ((-1 << ((byte)uVar9 & 0x1f)) - uVar6 < 0xfffffc00) goto LAB_001c486c;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar5);
        }
        bVar4 = BitStreamReader::getBit(this_00);
        if (bVar4) {
          BitStreamReader::skipBits(this_00,0x20);
          BitStreamReader::skipBits(this_00,0x20);
          BitStreamReader::skipBit(this_00);
        }
        (this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] =
             ((*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
              *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8 -
             (this->super_NALUnit).bitReader.m_bitLeft) + 0x40;
        bVar4 = BitStreamReader::getBit(this_00);
        pHVar3 = (this_01->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar3[uVar11].isPresent = bVar4;
        if (bVar4) {
          iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
          uVar9 = (this->super_NALUnit).bitReader.m_bitLeft;
          iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer;
          iVar7 = hrd_parameters(this,pHVar3 + uVar11);
          if (iVar7 != 0) break;
          (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11].bitLen =
               (((iVar1 - iVar2) * 8 + uVar9) - (this->super_NALUnit).bitReader.m_bitLeft) +
               (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
               *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
        }
        bVar4 = BitStreamReader::getBit(this_00);
        pHVar3 = (this_02->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar3[uVar11].isPresent = bVar4;
        if (bVar4) {
          iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
          uVar9 = (this->super_NALUnit).bitReader.m_bitLeft;
          iVar2 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer;
          iVar7 = hrd_parameters(this,pHVar3 + uVar11);
          if (iVar7 != 0) break;
          (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11].bitLen =
               (((iVar1 - iVar2) * 8 + uVar9) - (this->super_NALUnit).bitReader.m_bitLeft) +
               (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
               *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
        }
        if (((this_01->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11].isPresent != false) ||
           ((this_02->super__Vector_base<HRDParams,_std::allocator<HRDParams>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar11].isPresent == true)) {
          BitStreamReader::skipBit(this_00);
        }
        BitStreamReader::skipBit(this_00);
        uVar11 = uVar11 + 1;
        local_69 = uVar11 < local_38;
      } while (uVar11 != local_38);
    }
LAB_001c486c:
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar6 = (uint)local_69;
  }
  return uVar6;
}

Assistant:

int SPSUnit::mvc_vui_parameters_extension()
{
    const unsigned vui_mvc_num_ops = extractUEGolombCode() + 1;
    if (vui_mvc_num_ops > 1 << 10)
        return 1;
    std::vector<uint8_t> vui_mvc_temporal_id;
    vui_mvc_temporal_id.resize(vui_mvc_num_ops);
    mvcHrdParamsBitPos.resize(vui_mvc_num_ops);
    mvcNalHrdParams.resize(vui_mvc_num_ops);
    mvcVclHrdParams.resize(vui_mvc_num_ops);

    for (size_t i = 0; i < vui_mvc_num_ops; i++)
    {
        vui_mvc_temporal_id[i] = bitReader.getBits<uint8_t>(3);
        const unsigned vui_mvc_num_target_output_views = extractUEGolombCode() + 1;
        if (vui_mvc_num_target_output_views > 1 << 10)
            return 1;
        for (size_t j = 0; j < vui_mvc_num_target_output_views; j++)
            if (extractUEGolombCode() >= 1 << 10)  // vui_mvc_view_id[ i ][ j ]
                return 1;

        if (bitReader.getBit())  // vui_mvc_timing_info_present_flag[ i ]
        {
            bitReader.skipBits(32);  // vui_mvc_num_units_in_tick[i]
            bitReader.skipBits(32);  // vui_mvc_time_scale[ i ]
            bitReader.skipBit();     // vui_mvc_fixed_frame_rate_flag[ i ]
        }

        mvcHrdParamsBitPos[i] = bitReader.getBitsCount() + 32;
        mvcNalHrdParams[i].isPresent = bitReader.getBit();
        if (mvcNalHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcNalHrdParams[i]) != 0)
                return 1;
            mvcNalHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        mvcVclHrdParams[i].isPresent = bitReader.getBit();
        if (mvcVclHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcVclHrdParams[i]) != 0)
                return 1;
            mvcVclHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        if (mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
            bitReader.skipBit();  // vui_mvc_low_delay_hrd_flag[i]
        bitReader.skipBit();      // vui_mvc_pic_struct_present_flag[i]
    }
    return 0;
}